

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::setParent_helper(QObjectPrivate *this,QObject *o)

{
  QObjectPrivate *pQVar1;
  qsizetype qVar2;
  reference ppQVar3;
  Type pQVar4;
  Type pQVar5;
  QObject *in_RSI;
  QObjectPrivate *in_RDI;
  long in_FS_OFFSET;
  int index;
  QObjectPrivate *parentD;
  QEvent e_3;
  QChildEvent e_2;
  QEvent e_1;
  QChildEvent e;
  QObject *q;
  QEvent *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  QObject **in_stack_ffffffffffffff18;
  Type type;
  QChildEvent *in_stack_ffffffffffffff20;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  QObject *local_68;
  QMessageLogger local_58;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  QObject *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = q_func(in_RDI);
  if (in_RSI != (in_RDI->super_QObjectData).parent) {
    if (((in_RDI->super_QObjectData).parent != (QObject *)0x0) &&
       ((((pQVar1 = QObject::d_func((QObject *)0x3ecec0),
          (*(uint *)&(pQVar1->super_QObjectData).field_0x30 >> 3 & 1) == 0 ||
          ((*(uint *)&(in_RDI->super_QObjectData).field_0x30 >> 2 & 1) == 0)) ||
         ((pQVar1->field_3).currentChildBeingDeleted != local_10)) &&
        (qVar2 = QListSpecialMethodsBase<QObject*>::indexOf<QObject*>
                           ((QListSpecialMethodsBase<QObject_*> *)in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18,
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
        -1 < (int)qVar2)))) {
      if ((*(uint *)&(pQVar1->super_QObjectData).field_0x30 >> 3 & 1) == 0) {
        QList<QObject_*>::removeAt
                  ((QList<QObject_*> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                   ,(qsizetype)in_stack_ffffffffffffff08);
        if (((*(uint *)&(in_RDI->super_QObjectData).field_0x30 >> 4 & 1) != 0) &&
           ((*(uint *)&(pQVar1->super_QObjectData).field_0x30 >> 5 & 1) != 0)) {
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          QChildEvent::QChildEvent
                    (in_stack_ffffffffffffff20,(Type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (QObject *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          QCoreApplication::sendEvent
                    ((QObject *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
          QChildEvent::~QChildEvent((QChildEvent *)0x3ed002);
        }
      }
      else {
        ppQVar3 = QList<QObject_*>::operator[]
                            ((QList<QObject_*> *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             (qsizetype)in_stack_ffffffffffffff08);
        *ppQVar3 = (QObject *)0x0;
      }
    }
    if ((*(uint *)&(in_RDI->super_QObjectData).field_0x30 >> 0xb & 1) != 0) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)local_38,ParentAboutToChange);
      QCoreApplication::sendEvent
                ((QObject *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      QEvent::~QEvent((QEvent *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    (in_RDI->super_QObjectData).parent = in_RSI;
    if ((in_RDI->super_QObjectData).parent != (QObject *)0x0) {
      pQVar4 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                         ((QBasicAtomicPointer<QThreadData> *)0x3ed0d7);
      QObject::d_func((QObject *)0x3ed0ed);
      pQVar5 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                         ((QBasicAtomicPointer<QThreadData> *)0x3ed0f9);
      if (pQVar4 != pQVar5) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff08);
        QMessageLogger::warning
                  (&local_58,
                   "QObject::setParent: Cannot set parent, new parent is in a different thread");
        (in_RDI->super_QObjectData).parent = (QObject *)0x0;
        goto LAB_003ed2ae;
      }
      QObject::d_func((QObject *)0x3ed152);
      type = (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      QList<QObject_*>::append
                ((QList<QObject_*> *)0x3ed166,(parameter_type)in_stack_ffffffffffffff08);
      if ((((*(uint *)&(in_RDI->super_QObjectData).field_0x30 >> 4 & 1) != 0) &&
          (pQVar1 = QObject::d_func((QObject *)0x3ed18b),
          (*(uint *)&(pQVar1->super_QObjectData).field_0x30 >> 5 & 1) != 0)) &&
         ((*(uint *)&(in_RDI->super_QObjectData).field_0x30 & 1) == 0)) {
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        QChildEvent::QChildEvent
                  ((QChildEvent *)local_78,type,
                   (QObject *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        QCoreApplication::sendEvent
                  ((QObject *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        QChildEvent::~QChildEvent((QChildEvent *)0x3ed213);
      }
    }
    if ((*(uint *)&(in_RDI->super_QObjectData).field_0x30 >> 0xb & 1) != 0) {
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)local_88,ParentChange);
      QCoreApplication::sendEvent
                ((QObject *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      QEvent::~QEvent((QEvent *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
  }
LAB_003ed2ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObjectPrivate::setParent_helper(QObject *o)
{
    Q_Q(QObject);
    Q_ASSERT_X(q != o, Q_FUNC_INFO, "Cannot parent a QObject to itself");
#ifdef QT_DEBUG
    const auto checkForParentChildLoops = qScopeGuard([&](){
        int depth = 0;
        auto p = parent;
        while (p) {
            if (++depth == CheckForParentChildLoopsWarnDepth) {
                qWarning("QObject %p (class: '%s', object name: '%s') may have a loop in its parent-child chain; "
                         "this is undefined behavior",
                         q, q->metaObject()->className(), qPrintable(q->objectName()));
            }
            p = p->parent();
        }
    });
#endif

    if (o == parent)
        return;

    if (parent) {
        QObjectPrivate *parentD = parent->d_func();
        if (parentD->isDeletingChildren && wasDeleted
            && parentD->currentChildBeingDeleted == q) {
            // don't do anything since QObjectPrivate::deleteChildren() already
            // cleared our entry in parentD->children.
        } else {
            const int index = parentD->children.indexOf(q);
            if (index < 0) {
                // we're probably recursing into setParent() from a ChildRemoved event, don't do anything
            } else if (parentD->isDeletingChildren) {
                parentD->children[index] = nullptr;
            } else {
                parentD->children.removeAt(index);
                if (sendChildEvents && parentD->receiveChildEvents) {
                    QChildEvent e(QEvent::ChildRemoved, q);
                    QCoreApplication::sendEvent(parent, &e);
                }
            }
        }
    }

    if (receiveParentEvents) {
        Q_ASSERT(!isWidget); // Handled in QWidget
        QEvent e(QEvent::ParentAboutToChange);
        QCoreApplication::sendEvent(q, &e);
    }

    parent = o;

    if (parent) {
        // object hierarchies are constrained to a single thread
        if (threadData.loadRelaxed() != parent->d_func()->threadData.loadRelaxed()) {
            qWarning("QObject::setParent: Cannot set parent, new parent is in a different thread");
            parent = nullptr;
            return;
        }
        parent->d_func()->children.append(q);
        if (sendChildEvents && parent->d_func()->receiveChildEvents) {
            if (!isWidget) {
                QChildEvent e(QEvent::ChildAdded, q);
                QCoreApplication::sendEvent(parent, &e);
            }
        }
    }

    if (receiveParentEvents) {
        Q_ASSERT(!isWidget); // Handled in QWidget
        QEvent e(QEvent::ParentChange);
        QCoreApplication::sendEvent(q, &e);
    }
}